

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_soft.c
# Opt level: O1

void shader_grad_any_first
               (uintptr_t state,int start_x,int start_y,ALLEGRO_VERTEX *v1,ALLEGRO_VERTEX *v2)

{
  float major_delta_param;
  float minor_delta_param;
  float param;
  float local_54;
  float local_50;
  float local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38._0_4_ = (v1->color).r;
  local_38._4_4_ = (v1->color).g;
  uStack_30._0_4_ = (v1->color).b;
  uStack_30._4_4_ = (v1->color).a;
  local_48._0_4_ = (v2->color).r;
  local_48._4_4_ = (v2->color).g;
  uStack_40._0_4_ = (v2->color).b;
  uStack_40._4_4_ = (v2->color).a;
  get_interpolation_parameters(start_x,start_y,v1,v2,&local_4c,&local_50,&local_54);
  local_48._0_4_ = (float)local_48 - (float)local_38;
  local_48._4_4_ = local_48._4_4_ - local_38._4_4_;
  uStack_40._0_4_ = (float)uStack_40 - (float)uStack_30;
  uStack_40._4_4_ = uStack_40._4_4_ - uStack_30._4_4_;
  *(float *)state = local_4c * (float)local_48 + (float)local_38;
  *(float *)(state + 4) = local_4c * local_48._4_4_ + local_38._4_4_;
  *(float *)(state + 8) = local_4c * (float)uStack_40 + (float)uStack_30;
  *(float *)(state + 0xc) = local_4c * uStack_40._4_4_ + uStack_30._4_4_;
  *(float *)(state + 0x10) = local_50 * (float)local_48;
  *(float *)(state + 0x14) = local_50 * local_48._4_4_;
  *(float *)(state + 0x18) = local_50 * (float)uStack_40;
  *(float *)(state + 0x1c) = local_50 * uStack_40._4_4_;
  *(float *)(state + 0x20) = local_54 * (float)local_48;
  *(float *)(state + 0x24) = local_54 * local_48._4_4_;
  *(float *)(state + 0x28) = local_54 * (float)uStack_40;
  *(float *)(state + 0x2c) = local_54 * uStack_40._4_4_;
  return;
}

Assistant:

static void shader_grad_any_first(uintptr_t state, int start_x, int start_y, ALLEGRO_VERTEX* v1, ALLEGRO_VERTEX* v2)
{
   float param;
   float minor_delta_param;
   float major_delta_param;
   state_grad_any_2d* st = (state_grad_any_2d*)state;
   ALLEGRO_COLOR diff, v1c, v2c;

   v1c = v1->color;
   v2c = v2->color;

   get_interpolation_parameters(start_x, start_y, v1, v2, &param, &minor_delta_param, &major_delta_param);
  
   diff.a = v2c.a - v1c.a;
   diff.r = v2c.r - v1c.r;
   diff.g = v2c.g - v1c.g;
   diff.b = v2c.b - v1c.b;
   
   st->solid.color.a = v1c.a + diff.a * param;
   st->solid.color.r = v1c.r + diff.r * param;
   st->solid.color.g = v1c.g + diff.g * param;
   st->solid.color.b = v1c.b + diff.b * param;
   
   st->minor_color.a = diff.a * minor_delta_param;
   st->minor_color.r = diff.r * minor_delta_param;
   st->minor_color.g = diff.g * minor_delta_param;
   st->minor_color.b = diff.b * minor_delta_param;
   
   st->major_color.a = diff.a * major_delta_param;
   st->major_color.r = diff.r * major_delta_param;
   st->major_color.g = diff.g * major_delta_param;
   st->major_color.b = diff.b * major_delta_param;
}